

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswRarity.c
# Opt level: O0

void Ssw_RarTranspose(Ssw_RarMan_t *p)

{
  word wVar1;
  int iVar2;
  word *pwVar3;
  int local_224;
  int local_220;
  int i;
  int r;
  int w;
  word M [64];
  Aig_Obj_t *pObj;
  Ssw_RarMan_t *p_local;
  
  for (i = 0; i < p->pPars->nWords; i = i + 1) {
    for (local_220 = 0; local_220 < p->nWordsReg; local_220 = local_220 + 1) {
      for (local_224 = 0; local_224 < 0x40; local_224 = local_224 + 1) {
        iVar2 = Aig_ManRegNum(p->pAig);
        if ((local_220 * 0x40 + 0x3f) - local_224 < iVar2) {
          M[0x3f] = (word)Saig_ManLi(p->pAig,(local_220 * 0x40 + 0x3f) - local_224);
          iVar2 = Aig_ObjId((Aig_Obj_t *)M[0x3f]);
          pwVar3 = Ssw_RarObjSim(p,iVar2);
          *(word *)(&r + (long)local_224 * 2) = pwVar3[i];
        }
        else {
          (&r + (long)local_224 * 2)[0] = 0;
          (&r + (long)local_224 * 2)[1] = 0;
        }
      }
      transpose64((word *)&r);
      for (local_224 = 0; local_224 < 0x40; local_224 = local_224 + 1) {
        wVar1 = *(word *)(&r + (long)local_224 * 2);
        pwVar3 = Ssw_RarPatSim(p,(i * 0x40 + 0x3f) - local_224);
        pwVar3[local_220] = wVar1;
      }
    }
  }
  return;
}

Assistant:

void Ssw_RarTranspose( Ssw_RarMan_t * p )
{
    Aig_Obj_t * pObj;
    word M[64];
    int w, r, i;
    for ( w = 0; w < p->pPars->nWords; w++ )
    for ( r = 0; r < p->nWordsReg; r++ )
    {
        // save input
        for ( i = 0; i < 64; i++ )
        {
            if ( r*64 + 63-i < Aig_ManRegNum(p->pAig) )
            {
                pObj = Saig_ManLi( p->pAig, r*64 + 63-i );
                M[i] = Ssw_RarObjSim( p, Aig_ObjId(pObj) )[w];
            }
            else
                M[i] = 0;
        }
        // transpose
        transpose64( M );
        // save output
        for ( i = 0; i < 64; i++ )
            Ssw_RarPatSim( p, w*64 + 63-i )[r] = M[i];
    }
/*
    Saig_ManForEachLi( p->pAig, pObj, i )
    {
        word * pBitData = Ssw_RarObjSim( p, Aig_ObjId(pObj) );
        Extra_PrintBinary( stdout, (unsigned *)pBitData, 64*p->pPars->nWords ); Abc_Print( 1, "\n" );
    }
    Abc_Print( 1, "\n" );
    for ( i = 0; i < p->pPars->nWords*64; i++ )
    {
        word * pBitData = Ssw_RarPatSim( p, i );
        Extra_PrintBinary( stdout, (unsigned *)pBitData, Aig_ManRegNum(p->pAig) ); Abc_Print( 1, "\n" );
    }
    Abc_Print( 1, "\n" );
*/
}